

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_short>
          (Memory *this,u32 offset,u32 addend,unsigned_short expect,unsigned_short replace,
          unsigned_short *out)

{
  bool bVar1;
  Result RVar2;
  unsigned_short local_32;
  unsigned_short *puStack_30;
  unsigned_short read;
  unsigned_short *out_local;
  u32 local_20;
  unsigned_short replace_local;
  unsigned_short expect_local;
  u32 addend_local;
  u32 offset_local;
  Memory *this_local;
  
  puStack_30 = out;
  out_local._4_2_ = replace;
  out_local._6_2_ = expect;
  local_20 = addend;
  _replace_local = offset;
  _addend_local = this;
  RVar2 = AtomicLoad<unsigned_short>(this,offset,addend,&local_32);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_32 == out_local._6_2_) {
      RVar2 = AtomicStore<unsigned_short>(this,_replace_local,local_20,out_local._4_2_);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *puStack_30 = local_32;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u32 offset,
                                u32 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}